

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<simd_test_ssse3::U64_V256V256_ssse3_TestIntrinsics_Test>
::CreateTest(ParameterizedTestFactory<simd_test_ssse3::U64_V256V256_ssse3_TestIntrinsics_Test> *this
            )

{
  Test *this_00;
  
  WithParamInterface<std::tuple<unsigned_int,unsigned_int,char_const*>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x28);
  simd_test_ssse3::U64_V256V256_ssse3_TestIntrinsics_Test::U64_V256V256_ssse3_TestIntrinsics_Test
            ((U64_V256V256_ssse3_TestIntrinsics_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }